

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O2

void __thiscall Js::TinyDictionary::Add(TinyDictionary *this,PropertyId key,byte value)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  if ((char)value < '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x28,"(value < 128)","value < 128");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar5 = (ulong)((long)key * -0x61c8864680b583eb) >> 0x3c;
  cVar1 = *(char *)((long)this->bucketsData + uVar5);
  if ((value == '\x7f') || (cVar1 != -1)) {
    *(char *)((long)this[1].bucketsData + (ulong)value) = cVar1;
  }
  else {
    value = value | 0x80;
  }
  *(byte *)((long)this->bucketsData + uVar5) = value;
  return;
}

Assistant:

void Add(PropertyId key, byte value)
        {
            Assert(value < 128);

            byte* buckets = reinterpret_cast<byte*>(bucketsData);
            uint32 bucketIndex = ReduceKeyToIndex(key);

            byte i = buckets[bucketIndex];

            // if the bucket was empty (NIL), put a tagged value to indicate the end of the chain.
            // NB: [OS:17745531] In extreme rare cases 127th pid to insert hashes into a a bucket still unused by the previous 126 values.
            //     We cannot tag 127 since it would become NIL and we would lose the value. 
            //     We can however chain 127 --> NIL, since it is the same as having two 127 in the bucket, which is ok.
            if ((i == NIL) & (value != 127))
            {
                // set the highest bit to mark the value as the last in the chain
                buckets[bucketIndex] = value | 128;
            }
            else
            {
                buckets[bucketIndex] = value;
                next[value] = i;
            }
        }